

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.cpp
# Opt level: O2

string * __thiscall
OptionParser::getEpanet3Keyword
          (string *__return_storage_ptr__,OptionParser *this,string *s1,string *s2,string *value)

{
  int iVar1;
  allocator *paVar2;
  char *pcVar3;
  allocator local_37;
  allocator local_36;
  allocator local_35;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d;
  allocator local_2c;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  
  iVar1 = Utilities::findFullMatch(s1,epanet2Keywords);
  switch(iVar1) {
  case 0:
    paVar2 = &local_37;
    pcVar3 = indexOptionKeywords[1];
    break;
  case 1:
    paVar2 = &local_36;
    pcVar3 = indexOptionKeywords[2];
    break;
  case 2:
    paVar2 = &local_35;
    pcVar3 = stringOptionKeywords[4];
    break;
  case 3:
    paVar2 = &local_34;
    pcVar3 = stringOptionKeywords[0];
    break;
  default:
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s1);
    return __return_storage_ptr__;
  case 5:
    paVar2 = &local_33;
    pcVar3 = valueOptionKeywords[1];
    break;
  case 6:
    paVar2 = &local_32;
    pcVar3 = valueOptionKeywords[0xe];
    break;
  case 7:
    paVar2 = &local_31;
    pcVar3 = valueOptionKeywords[0];
    break;
  case 8:
    paVar2 = &local_30;
    pcVar3 = indexOptionKeywords[3];
    break;
  case 9:
    paVar2 = &local_2f;
    pcVar3 = valueOptionKeywords[9];
    break;
  case 10:
    std::__cxx11::string::_M_assign((string *)value);
    paVar2 = &local_2e;
    pcVar3 = indexOptionKeywords[4];
    break;
  case 0xb:
    paVar2 = &local_2d;
    pcVar3 = indexOptionKeywords[6];
    break;
  case 0xc:
    paVar2 = &local_2c;
    pcVar3 = valueOptionKeywords[2];
    break;
  case 0xd:
    paVar2 = &local_2b;
    pcVar3 = valueOptionKeywords[6];
    break;
  case 0xe:
    paVar2 = &local_2a;
    pcVar3 = valueOptionKeywords[0xf];
    break;
  case 0xf:
    paVar2 = &local_29;
    pcVar3 = stringOptionKeywords[3];
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,paVar2);
  return __return_storage_ptr__;
}

Assistant:

string OptionParser::getEpanet3Keyword(const string& s1, const string& s2,
                                       string& value)
{
    // ... check if first string matches an EPANET2 single keyword

    int i = Utilities::findFullMatch(s1, epanet2Keywords);
    if ( i < 0 ) return s1;

    // ... return the corresponding EPANET3 keyword
    //     ("i" is the index of the matching entry in epanet2Keywords)
    //

    switch(i)
    {
	case 0: return indexOptionKeywords[Options::FLOW_UNITS];
	case 1: return indexOptionKeywords[Options::PRESSURE_UNITS];
	case 2: return stringOptionKeywords[Options::HEADLOSS_MODEL];
	case 3: return stringOptionKeywords[Options::HYD_FILE_NAME];
	case 4: break;  //QUALITY keyword handled separately
	case 5: return valueOptionKeywords[Options::KIN_VISCOSITY];
	case 6: return valueOptionKeywords[Options::MOLEC_DIFFUSIVITY];
	case 7: return valueOptionKeywords[Options::SPEC_GRAVITY];
	case 8: return indexOptionKeywords[Options::MAX_TRIALS];
	case 9: return valueOptionKeywords[Options::RELATIVE_ACCURACY];
	case 10: value = s2; //make the 2nd token the option's value
             return indexOptionKeywords[Options::IF_UNBALANCED];
	case 11: return indexOptionKeywords[Options::DEMAND_PATTERN];
	case 12: return valueOptionKeywords[Options::DEMAND_MULTIPLIER];
	case 13: return valueOptionKeywords[Options::EMITTER_EXPONENT];
	case 14: return valueOptionKeywords[Options::QUAL_TOLERANCE];
	case 15: return stringOptionKeywords[Options::MAP_FILE_NAME];
    }
    return s1;
}